

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O3

void main_sheet_get_sheetfile_expat_callback_element_start
               (void *callbackdata,XML_Char *name,XML_Char **atts)

{
  char *__s2;
  int iVar1;
  XML_Char *pXVar2;
  long lVar3;
  
  __s2 = *(char **)((long)callbackdata + 0x18);
  if (((__s2 != (char *)0x0) && (iVar1 = XML_Char_icmp_ins(name,"Relationship"), iVar1 == 0)) &&
     (pXVar2 = get_expat_attr_by_name(atts,"Type"), pXVar2 != (XML_Char *)0x0)) {
    iVar1 = strcasecmp(pXVar2,
                       "http://schemas.openxmlformats.org/officeDocument/2006/relationships/worksheet"
                      );
    if (iVar1 == 0) {
      pXVar2 = get_expat_attr_by_name(atts,"Id");
      iVar1 = strcasecmp(pXVar2,__s2);
      if (iVar1 != 0) {
        return;
      }
      pXVar2 = get_expat_attr_by_name(atts,"Target");
      if (pXVar2 == (XML_Char *)0x0) {
        return;
      }
      lVar3 = 0x20;
    }
    else {
      iVar1 = strcasecmp(pXVar2,
                         "http://schemas.openxmlformats.org/officeDocument/2006/relationships/sharedStrings"
                        );
      if (iVar1 == 0) {
        pXVar2 = get_expat_attr_by_name(atts,"Target");
        if (pXVar2 == (XML_Char *)0x0) {
          return;
        }
        lVar3 = 0x28;
      }
      else {
        iVar1 = strcasecmp(pXVar2,
                           "http://schemas.openxmlformats.org/officeDocument/2006/relationships/styles"
                          );
        if (iVar1 != 0) {
          return;
        }
        pXVar2 = get_expat_attr_by_name(atts,"Target");
        if (pXVar2 == (XML_Char *)0x0) {
          return;
        }
        lVar3 = 0x30;
      }
    }
    if (*pXVar2 != '\0') {
      pXVar2 = join_basepath_filename(*(XML_Char **)((long)callbackdata + 0x10),pXVar2);
      *(XML_Char **)((long)callbackdata + lVar3) = pXVar2;
    }
  }
  return;
}

Assistant:

void main_sheet_get_sheetfile_expat_callback_element_start (void* callbackdata, const XML_Char* name, const XML_Char** atts)
{
  struct main_sheet_get_rels_callback_data* data = (struct main_sheet_get_rels_callback_data*)callbackdata;
  if (data->sheetrelid) {
    if (XML_Char_icmp_ins(name, X("Relationship")) == 0) {
      const XML_Char* reltype;
      if ((reltype = get_expat_attr_by_name(atts, X("Type"))) != NULL) {
        if (XML_Char_icmp(reltype, X("http://schemas.openxmlformats.org/officeDocument/2006/relationships/worksheet")) == 0) {
          const XML_Char* relid = get_expat_attr_by_name(atts, X("Id"));
          if (XML_Char_icmp(relid, data->sheetrelid) == 0) {
            const XML_Char* filename = get_expat_attr_by_name(atts, X("Target"));
            if (filename && *filename) {
              data->sheetfile = join_basepath_filename(data->basepath, filename);
            }
          }
        } else if (XML_Char_icmp(reltype, X("http://schemas.openxmlformats.org/officeDocument/2006/relationships/sharedStrings")) == 0) {
          const XML_Char* filename = get_expat_attr_by_name(atts, X("Target"));
          if (filename && *filename) {
            data->sharedstringsfile = join_basepath_filename(data->basepath, filename);
          }
        } else if (XML_Char_icmp(reltype, X("http://schemas.openxmlformats.org/officeDocument/2006/relationships/styles")) == 0) {
          const XML_Char* filename = get_expat_attr_by_name(atts, X("Target"));
          if (filename && *filename) {
            data->stylesfile = join_basepath_filename(data->basepath, filename);
          }
        }
      }
    }
  }
}